

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

uint64_t __thiscall ImportedFuncWrapper::getThunkValue(ImportedFuncWrapper *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t *ptr_1;
  uint64_t *ptr;
  void *thunkPtr;
  uint64_t ordinal;
  bool is64;
  ImportedFuncWrapper *this_local;
  ulong *puVar3;
  
  iVar1 = (*(((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  iVar2 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  puVar3 = (ulong *)CONCAT44(extraout_var,iVar2);
  if (puVar3 == (ulong *)0x0) {
    this_local = (ImportedFuncWrapper *)0x0;
  }
  else {
    if (iVar1 == 0x40) {
      thunkPtr = (void *)*puVar3;
      if (((ulong)thunkPtr & 0x8000000000000000) != 0) {
        thunkPtr = (void *)((ulong)thunkPtr ^ 0x8000000000000000);
      }
    }
    else {
      thunkPtr = (void *)(ulong)(uint)*puVar3;
      if (((uint)*puVar3 & 0x80000000) != 0) {
        thunkPtr = (void *)((ulong)thunkPtr ^ 0x80000000);
      }
    }
    this_local = (ImportedFuncWrapper *)thunkPtr;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ImportedFuncWrapper::getThunkValue()
{
    bool is64 = (m_Exe->getBitMode() == Executable::BITS_64) ? true : false;

    uint64_t ordinal = 0;
    void* thunkPtr = getPtr();
    if (!thunkPtr) return 0;

    if (is64) {
        uint64_t* ptr =  (uint64_t*) thunkPtr;
        ordinal = *ptr;
        if (ordinal & ORDINAL_FLAG64) ordinal ^= ORDINAL_FLAG64;

    } else {
        uint32_t* ptr =  (uint32_t*) thunkPtr;
        ordinal = *ptr;
        if (uint32_t(ordinal) & ORDINAL_FLAG32) ordinal ^= ORDINAL_FLAG32;
    }

    return ordinal;
}